

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void alist_restore_gpointers(t_alist *x,int offset,int count)

{
  t_listelem *local_20;
  t_listelem *vec;
  int count_local;
  int offset_local;
  t_alist *x_local;
  
  local_20 = x->l_vec + offset;
  vec._0_4_ = count;
  while ((int)vec != 0) {
    if ((local_20->l_a).a_type == A_POINTER) {
      (local_20->l_a).a_w.w_symbol = (t_symbol *)&local_20->l_p;
    }
    local_20 = local_20 + 1;
    vec._0_4_ = (int)vec + -1;
  }
  return;
}

Assistant:

static void alist_restore_gpointers(t_alist *x, int offset, int count)
{
    t_listelem *vec = x->l_vec + offset;
    while (count--)
    {
        if (vec->l_a.a_type == A_POINTER)
            vec->l_a.a_w.w_gpointer = &vec->l_p;
        vec++;
    }
}